

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O0

int FixedDiv_X86(int num,int div)

{
  int div_local;
  int num_local;
  
  return (int)(CONCAT44((num >> 0x1f) << 0x10 | (uint)num >> 0x10,num << 0x10) / (long)div);
}

Assistant:

int FixedDiv_X86(int num, int div) {
  asm volatile(
      "cdq                                       \n"
      "shld        $0x10,%%eax,%%edx             \n"
      "shl         $0x10,%%eax                   \n"
      "idiv        %1                            \n"
      "mov         %0, %%eax                     \n"
      : "+a"(num)  // %0
      : "c"(div)   // %1
      : "memory", "cc", "edx");
  return num;
}